

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

bool parser::operator==(Convolution *lhs,Convolution *rhs)

{
  pointer pGVar1;
  pointer pGVar2;
  pointer pGVar3;
  bool bVar4;
  long lVar5;
  pointer pGVar6;
  bool bVar7;
  bool bVar8;
  
  if (lhs->header == rhs->header) {
    pGVar1 = (lhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pGVar2 = (lhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pGVar3 = (rhs->body).
             super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((long)pGVar2 - (long)pGVar1 ==
        (long)(rhs->body).
              super__Vector_base<parser::GrammaticSymbol,_std::allocator<parser::GrammaticSymbol>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pGVar3) {
      if (pGVar1 == pGVar2) {
        return true;
      }
      lVar5 = 0;
      do {
        bVar7 = *(int *)((long)&pGVar1->value + lVar5) == *(int *)((long)&pGVar3->value + lVar5);
        bVar8 = (&pGVar1->isTerminal)[lVar5] == (&pGVar3->isTerminal)[lVar5];
        bVar4 = bVar8 && bVar7;
        if (!bVar8 || !bVar7) {
          return bVar4;
        }
        pGVar6 = (pointer)((long)&pGVar1[1].value + lVar5);
        lVar5 = lVar5 + 8;
      } while (pGVar6 != pGVar2);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool operator==(const Convolution& lhs, const Convolution& rhs) {
            return lhs.header == rhs.header &&
                   lhs.body == rhs.body;
        }